

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O1

Vector3f __thiscall Quat4f::getAxisAngle(Quat4f *this,float *radiansOut)

{
  undefined1 auVar1 [16];
  float *in_RDX;
  double dVar2;
  ulong uVar3;
  float y;
  float fVar4;
  Vector3f VVar5;
  
  dVar2 = acos((double)*radiansOut);
  auVar1 = vfmadd231ss_fma(ZEXT416((uint)(radiansOut[2] * radiansOut[2])),
                           ZEXT416((uint)radiansOut[1]),ZEXT416((uint)radiansOut[1]));
  auVar1 = vfmadd213ss_fma(ZEXT416((uint)radiansOut[3]),ZEXT416((uint)radiansOut[3]),auVar1);
  if (auVar1._0_4_ < 0.0) {
    fVar4 = sqrtf(auVar1._0_4_);
  }
  else {
    auVar1 = vsqrtss_avx(auVar1,auVar1);
    fVar4 = auVar1._0_4_;
  }
  fVar4 = 1.0 / fVar4;
  *in_RDX = (float)(dVar2 + dVar2);
  uVar3 = (ulong)(uint)(fVar4 * radiansOut[1]);
  y = fVar4 * radiansOut[2];
  Vector3f::Vector3f((Vector3f *)this,fVar4 * radiansOut[1],y,fVar4 * radiansOut[3]);
  VVar5.m_elements[2] = y;
  VVar5.m_elements[0] = (float)(int)uVar3;
  VVar5.m_elements[1] = (float)(int)(uVar3 >> 0x20);
  return (Vector3f)VVar5.m_elements;
}

Assistant:

Vector3f Quat4f::getAxisAngle( float* radiansOut )
{
	float theta = acos( w() ) * 2;
	float vectorNorm = sqrt( x() * x() + y() * y() + z() * z() );
	float reciprocalVectorNorm = 1.f / vectorNorm;

	*radiansOut = theta;
	return Vector3f
	(
		x() * reciprocalVectorNorm,
		y() * reciprocalVectorNorm,
		z() * reciprocalVectorNorm
	);
}